

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void tcd_malloc_decode_tile
               (opj_tcd_t *tcd,opj_image_t *image,opj_cp_t *cp,int tileno,
               opj_codestream_info_t *cstr_info)

{
  long lVar1;
  opj_tcd_band_t *poVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  opj_tcd_tile_t *poVar7;
  opj_tcp_t *poVar8;
  opj_image_comp_t *poVar9;
  ulong uVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  opj_tcd_resolution_t *poVar16;
  opj_tcd_precinct_t *poVar17;
  opj_tcd_cblk_enc_t *poVar18;
  opj_tgt_tree_t *poVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  OPJ_UINT32 OVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  opj_tcd_tilecomp_t *poVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  uint uVar36;
  uint uVar37;
  OPJ_UINT32 OVar38;
  long lVar39;
  opj_tccp_t *poVar40;
  uint uVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  int iVar49;
  double dVar47;
  undefined1 auVar48 [16];
  int iVar50;
  int iVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int local_c0;
  
  tcd->cp = cp;
  iVar4 = cp->tileno[tileno];
  poVar7 = tcd->tcd_image->tiles;
  iVar29 = poVar7[iVar4].numcomps;
  if (0 < iVar29) {
    poVar7 = poVar7 + iVar4;
    poVar8 = cp->tcps;
    lVar35 = 0;
    do {
      poVar40 = poVar8[iVar4].tccps;
      poVar27 = poVar7->comps;
      poVar9 = image->comps;
      OVar23 = poVar9[lVar35].dx;
      poVar27[lVar35].x0 = (int)(poVar7->x0 + (OVar23 - 1)) / (int)OVar23;
      OVar38 = poVar9[lVar35].dy;
      poVar27[lVar35].y0 = (int)(poVar7->y0 + (OVar38 - 1)) / (int)OVar38;
      poVar27[lVar35].x1 = (int)((OVar23 - 1) + poVar7->x1) / (int)OVar23;
      poVar27[lVar35].y1 = (int)((OVar38 - 1) + poVar7->y1) / (int)OVar38;
      OVar23 = poVar40[lVar35].numresolutions;
      lVar39 = (long)(int)OVar23;
      poVar27[lVar35].numresolutions = OVar23;
      poVar16 = (opj_tcd_resolution_t *)malloc(lVar39 * 0x98);
      poVar27[lVar35].resolutions = poVar16;
      if (0 < lVar39) {
        poVar40 = poVar40 + lVar35;
        poVar27 = poVar27 + lVar35;
        lVar42 = 0;
        do {
          uVar41 = (uint)lVar42;
          uVar22 = ~uVar41 + (int)lVar39;
          bVar20 = (byte)uVar22;
          poVar16 = poVar27->resolutions;
          uVar13 = ~(-1 << (bVar20 & 0x1f));
          uVar28 = (int)(poVar27->x0 + uVar13) >> (bVar20 & 0x1f);
          poVar16[lVar42].x0 = uVar28;
          uVar31 = (int)(poVar27->y0 + uVar13) >> (bVar20 & 0x1f);
          poVar16[lVar42].y0 = uVar31;
          uVar34 = (int)(poVar27->x1 + uVar13) >> (bVar20 & 0x1f);
          poVar16[lVar42].x1 = uVar34;
          uVar33 = (int)(poVar27->y1 + uVar13) >> (bVar20 & 0x1f);
          poVar16[lVar42].y1 = uVar33;
          poVar16[lVar42].numbands = (uint)(lVar42 != 0) * 2 + 1;
          OVar38 = 0xf;
          OVar23 = 0xf;
          if ((poVar40->csty & 1) != 0) {
            OVar23 = poVar40->prcw[lVar42];
            OVar38 = poVar40->prch[lVar42];
          }
          bVar20 = (byte)OVar23;
          uVar43 = -1 << (bVar20 & 0x1f);
          bVar21 = (byte)OVar38;
          uVar36 = -1 << (bVar21 & 0x1f);
          uVar37 = uVar36 & uVar31;
          uVar44 = uVar43 & uVar28;
          iVar29 = (int)((((1 << (bVar20 & 0x1f)) + uVar34) - 1 & uVar43) - uVar44) >>
                   (bVar20 & 0x1f);
          if (uVar28 == uVar34) {
            iVar29 = 0;
          }
          iVar14 = (int)((((1 << (bVar21 & 0x1f)) + uVar33) - 1 & uVar36) - uVar37) >>
                   (bVar21 & 0x1f);
          if (uVar31 == uVar33) {
            iVar14 = 0;
          }
          poVar16[lVar42].pw = iVar29;
          poVar16[lVar42].ph = iVar14;
          if (lVar42 != 0) {
            uVar44 = (int)(uVar44 + 1) >> 1;
            uVar37 = (int)(uVar37 + 1) >> 1;
            OVar23 = OVar23 - 1;
            OVar38 = OVar38 - 1;
          }
          OVar11 = poVar40->cblkw;
          if ((int)OVar23 <= (int)poVar40->cblkw) {
            OVar11 = OVar23;
          }
          OVar12 = poVar40->cblkh;
          if ((int)OVar38 <= (int)poVar40->cblkh) {
            OVar12 = OVar38;
          }
          uVar28 = (int)lVar39 - uVar41;
          iVar29 = 1 << ((byte)uVar28 & 0x1f);
          local_c0 = uVar41 * 3 + -2;
          bVar20 = (byte)OVar11;
          bVar21 = (byte)OVar12;
          auVar51 = ZEXT416(uVar28);
          lVar39 = 0;
          do {
            lVar1 = lVar39 + 1;
            iVar14 = (int)lVar1;
            if (lVar42 == 0) {
              iVar14 = 0;
            }
            poVar16[lVar42].bands[lVar39].bandno = iVar14;
            if (lVar42 == 0) {
              iVar46 = (int)(poVar27->x0 + uVar13) >> ZEXT416(uVar22);
              iVar49 = (int)(poVar27->y0 + uVar13) >> ZEXT416(uVar22);
              iVar50 = (int)(poVar27->x1 + uVar13) >> ZEXT416(uVar22);
              iVar54 = (int)(poVar27->y1 + uVar13) >> ZEXT416(uVar22);
              lVar25 = 0;
            }
            else {
              auVar52._0_4_ = -(uint)((int)lVar39 == 0);
              auVar52._8_4_ = -(uint)((int)lVar1 == 2);
              auVar52._12_4_ = -(uint)((int)((ulong)lVar1 >> 0x20) == 0);
              auVar48._4_4_ = auVar52._12_4_;
              auVar48._0_4_ = -(uint)((int)((ulong)lVar39 >> 0x20) == 0);
              auVar48._8_4_ = auVar52._12_4_;
              auVar48._12_4_ = auVar52._8_4_;
              auVar52._4_4_ = auVar52._8_4_;
              auVar52 = auVar52 & auVar48;
              auVar53._0_4_ = auVar52._0_4_ >> 0x1f;
              auVar53._4_4_ = auVar52._4_4_ >> 0x1f;
              auVar53._8_4_ = auVar52._8_4_ >> 0x1f;
              auVar53._12_4_ = auVar52._12_4_ >> 0x1f;
              auVar53 = auVar53 | ~auVar52 & ZEXT516(CONCAT14(lVar1 == 3,(uint)(lVar1 == 3)));
              iVar50 = (auVar53._0_4_ << uVar22 ^ 0xffffffffU) + iVar29;
              iVar54 = (auVar53._4_4_ ^ 0xffffffff) + iVar29;
              iVar46 = poVar27->x0 + iVar50 >> auVar51;
              iVar49 = poVar27->y0 + iVar54 >> auVar51;
              iVar50 = poVar27->x1 + iVar50 >> auVar51;
              iVar54 = poVar27->y1 + iVar54 >> auVar51;
              lVar25 = (long)((int)lVar39 + local_c0);
            }
            poVar2 = poVar16[lVar42].bands + lVar39;
            poVar2->x0 = iVar46;
            poVar2->y0 = iVar49;
            poVar2->x1 = iVar50;
            poVar2->y1 = iVar54;
            if (poVar40->qmfbid == 0) {
              iVar14 = dwt_getgain_real(iVar14);
            }
            else {
              iVar14 = dwt_getgain(iVar14);
            }
            iVar46 = poVar40->stepsizes[lVar25].mant;
            iVar49 = poVar40->stepsizes[lVar25].expn;
            dVar47 = ldexp(1.0,(iVar14 + image->comps[lVar35].prec) - iVar49);
            poVar2->stepsize = (float)(dVar47 * 0.5 * ((double)iVar46 * 0.00048828125 + 1.0));
            poVar2->numbps = iVar49 + -1 + poVar40->numgbits;
            lVar39 = (long)poVar16[lVar42].pw;
            lVar25 = poVar16[lVar42].ph * lVar39;
            poVar17 = (opj_tcd_precinct_t *)malloc(lVar25 * 0x30);
            poVar2->precincts = poVar17;
            if (0 < (int)lVar25) {
              uVar32 = 0;
              do {
                uVar30 = (ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar32 & 0xffffffff;
                iVar50 = (int)((long)uVar30 % (long)(int)lVar39);
                iVar14 = (int)((long)uVar30 / (long)(int)lVar39);
                iVar46 = (iVar50 << ((byte)OVar23 & 0x1f)) + uVar44;
                iVar49 = (iVar14 << ((byte)OVar38 & 0x1f)) + uVar37;
                iVar50 = (iVar50 + 1 << ((byte)OVar23 & 0x1f)) + uVar44;
                iVar14 = (iVar14 + 1 << ((byte)OVar38 & 0x1f)) + uVar37;
                poVar17 = poVar2->precincts;
                if (iVar46 <= poVar2->x0) {
                  iVar46 = poVar2->x0;
                }
                poVar17[uVar32].x0 = iVar46;
                if (iVar49 <= poVar2->y0) {
                  iVar49 = poVar2->y0;
                }
                poVar17[uVar32].y0 = iVar49;
                if (poVar2->x1 <= iVar50) {
                  iVar50 = poVar2->x1;
                }
                poVar17[uVar32].x1 = iVar50;
                if (poVar2->y1 <= iVar14) {
                  iVar14 = poVar2->y1;
                }
                iVar46 = iVar46 >> (bVar20 & 0x1f);
                iVar49 = iVar49 >> (bVar21 & 0x1f);
                poVar17[uVar32].y1 = iVar14;
                iVar50 = ((iVar50 + ~(-1 << (bVar20 & 0x1f)) >> (bVar20 & 0x1f)) - iVar46 <<
                         (bVar20 & 0x1f)) >> (bVar20 & 0x1f);
                poVar17[uVar32].cw = iVar50;
                iVar14 = ((iVar14 + ~(-1 << (bVar21 & 0x1f)) >> (bVar21 & 0x1f)) - iVar49 <<
                         (bVar21 & 0x1f)) >> (bVar21 & 0x1f);
                poVar17[uVar32].ch = iVar14;
                poVar18 = (opj_tcd_cblk_enc_t *)malloc((long)(iVar14 * iVar50) * 0x38);
                poVar17[uVar32].cblks.enc = poVar18;
                poVar19 = tgt_create(iVar50,iVar14);
                poVar17[uVar32].incltree = poVar19;
                poVar19 = tgt_create(poVar17[uVar32].cw,poVar17[uVar32].ch);
                poVar17[uVar32].imsbtree = poVar19;
                iVar14 = poVar17[uVar32].cw;
                uVar28 = poVar17[uVar32].ch * iVar14;
                if (0 < (int)uVar28) {
                  poVar17 = poVar17 + uVar32;
                  iVar50 = poVar17->x0;
                  iVar54 = poVar17->y0;
                  iVar5 = poVar17->x1;
                  iVar6 = poVar17->y1;
                  lVar39 = 0x30;
                  uVar30 = 0;
                  do {
                    uVar10 = (ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | uVar30 & 0xffffffff;
                    iVar15 = (int)((long)uVar10 / (long)iVar14);
                    iVar24 = (int)((long)uVar10 % (long)iVar14);
                    iVar26 = iVar24 + iVar46 << (bVar20 & 0x1f);
                    iVar45 = iVar15 + iVar49 << (bVar21 & 0x1f);
                    iVar24 = iVar24 + iVar46 + 1 << (bVar20 & 0x1f);
                    iVar15 = iVar15 + iVar49 + 1 << (bVar21 & 0x1f);
                    poVar18 = (poVar17->cblks).enc;
                    if (iVar26 <= iVar50) {
                      iVar26 = iVar50;
                    }
                    puVar3 = (undefined8 *)((long)poVar18 + lVar39 + -0x30);
                    *puVar3 = 0;
                    puVar3[1] = 0;
                    *(int *)((long)poVar18 + lVar39 + -0x20) = iVar26;
                    if (iVar45 <= iVar54) {
                      iVar45 = iVar54;
                    }
                    *(int *)((long)poVar18 + lVar39 + -0x1c) = iVar45;
                    if (iVar5 <= iVar24) {
                      iVar24 = iVar5;
                    }
                    *(int *)((long)poVar18 + lVar39 + -0x18) = iVar24;
                    if (iVar6 <= iVar15) {
                      iVar15 = iVar6;
                    }
                    *(int *)((long)poVar18 + lVar39 + -0x14) = iVar15;
                    *(undefined4 *)((long)&poVar18->data + lVar39) = 0;
                    uVar30 = uVar30 + 1;
                    lVar39 = lVar39 + 0x38;
                  } while (uVar28 != uVar30);
                }
                uVar32 = uVar32 + 1;
                lVar39 = (long)poVar16[lVar42].pw;
              } while ((long)uVar32 < poVar16[lVar42].ph * lVar39);
            }
            lVar39 = lVar1;
          } while (lVar1 < poVar16[lVar42].numbands);
          lVar39 = (long)poVar27->numresolutions;
          lVar42 = lVar42 + 1;
        } while (lVar42 < lVar39);
        iVar29 = poVar7->numcomps;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 < iVar29);
  }
  return;
}

Assistant:

void tcd_malloc_decode_tile(opj_tcd_t *tcd, opj_image_t * image, opj_cp_t * cp, int tileno, opj_codestream_info_t *cstr_info) {
	int compno, resno, bandno, precno, cblkno;
	opj_tcp_t *tcp;
	opj_tcd_tile_t *tile;

	OPJ_ARG_NOT_USED(cstr_info);

	tcd->cp = cp;
	
	tcp = &(cp->tcps[cp->tileno[tileno]]);
	tile = &(tcd->tcd_image->tiles[cp->tileno[tileno]]);
	
	tileno = cp->tileno[tileno];
	
	for (compno = 0; compno < tile->numcomps; compno++) {
		opj_tccp_t *tccp = &tcp->tccps[compno];
		opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
		
		/* border of each tile component (global) */
		tilec->x0 = int_ceildiv(tile->x0, image->comps[compno].dx);
		tilec->y0 = int_ceildiv(tile->y0, image->comps[compno].dy);
		tilec->x1 = int_ceildiv(tile->x1, image->comps[compno].dx);
		tilec->y1 = int_ceildiv(tile->y1, image->comps[compno].dy);

		tilec->numresolutions = tccp->numresolutions;
		tilec->resolutions = (opj_tcd_resolution_t *) opj_malloc(tilec->numresolutions * sizeof(opj_tcd_resolution_t));
		
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			int pdx, pdy;
			int levelno = tilec->numresolutions - 1 - resno;
			int tlprcxstart, tlprcystart, brprcxend, brprcyend;
			int tlcbgxstart, tlcbgystart, brcbgxend, brcbgyend;
			int cbgwidthexpn, cbgheightexpn;
			int cblkwidthexpn, cblkheightexpn;
			
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			
			/* border for each resolution level (global) */
			res->x0 = int_ceildivpow2(tilec->x0, levelno);
			res->y0 = int_ceildivpow2(tilec->y0, levelno);
			res->x1 = int_ceildivpow2(tilec->x1, levelno);
			res->y1 = int_ceildivpow2(tilec->y1, levelno);
			res->numbands = resno == 0 ? 1 : 3;
			
			/* p. 35, table A-23, ISO/IEC FDIS154444-1 : 2000 (18 august 2000) */
			if (tccp->csty & J2K_CCP_CSTY_PRT) {
				pdx = tccp->prcw[resno];
				pdy = tccp->prch[resno];
			} else {
				pdx = 15;
				pdy = 15;
			}			
			
			/* p. 64, B.6, ISO/IEC FDIS15444-1 : 2000 (18 august 2000)  */
			tlprcxstart = int_floordivpow2(res->x0, pdx) << pdx;
			tlprcystart = int_floordivpow2(res->y0, pdy) << pdy;
			brprcxend = int_ceildivpow2(res->x1, pdx) << pdx;
			brprcyend = int_ceildivpow2(res->y1, pdy) << pdy;
			
			res->pw = (res->x0 == res->x1) ? 0 : ((brprcxend - tlprcxstart) >> pdx);
			res->ph = (res->y0 == res->y1) ? 0 : ((brprcyend - tlprcystart) >> pdy);
			
			if (resno == 0) {
				tlcbgxstart = tlprcxstart;
				tlcbgystart = tlprcystart;
				brcbgxend = brprcxend;
				brcbgyend = brprcyend;
				cbgwidthexpn = pdx;
				cbgheightexpn = pdy;
			} else {
				tlcbgxstart = int_ceildivpow2(tlprcxstart, 1);
				tlcbgystart = int_ceildivpow2(tlprcystart, 1);
				brcbgxend = int_ceildivpow2(brprcxend, 1);
				brcbgyend = int_ceildivpow2(brprcyend, 1);
				cbgwidthexpn = pdx - 1;
				cbgheightexpn = pdy - 1;
			}
			
			cblkwidthexpn = int_min(tccp->cblkw, cbgwidthexpn);
			cblkheightexpn = int_min(tccp->cblkh, cbgheightexpn);
			
			for (bandno = 0; bandno < res->numbands; bandno++) {
				int x0b, y0b;
				int gain, numbps;
				opj_stepsize_t *ss = NULL;
				
				opj_tcd_band_t *band = &res->bands[bandno];
				band->bandno = resno == 0 ? 0 : bandno + 1;
				x0b = (band->bandno == 1) || (band->bandno == 3) ? 1 : 0;
				y0b = (band->bandno == 2) || (band->bandno == 3) ? 1 : 0;
				
				if (band->bandno == 0) {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0, levelno);
					band->y0 = int_ceildivpow2(tilec->y0, levelno);
					band->x1 = int_ceildivpow2(tilec->x1, levelno);
					band->y1 = int_ceildivpow2(tilec->y1, levelno);
				} else {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0 - (1 << levelno) * x0b, levelno + 1);
					band->y0 = int_ceildivpow2(tilec->y0 - (1 << levelno) * y0b, levelno + 1);
					band->x1 = int_ceildivpow2(tilec->x1 - (1 << levelno) * x0b, levelno + 1);
					band->y1 = int_ceildivpow2(tilec->y1 - (1 << levelno) * y0b, levelno + 1);
				}
				
				ss = &tccp->stepsizes[resno == 0 ? 0 : 3 * (resno - 1) + bandno + 1];
				gain = tccp->qmfbid == 0 ? dwt_getgain_real(band->bandno) : dwt_getgain(band->bandno);
				numbps = image->comps[compno].prec + gain;
				band->stepsize = (float)(((1.0 + ss->mant / 2048.0) * pow(2.0, numbps - ss->expn)) * 0.5);
				band->numbps = ss->expn + tccp->numgbits - 1;	/* WHY -1 ? */
				
				band->precincts = (opj_tcd_precinct_t *) opj_malloc(res->pw * res->ph * sizeof(opj_tcd_precinct_t));
				
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					int tlcblkxstart, tlcblkystart, brcblkxend, brcblkyend;
					int cbgxstart = tlcbgxstart + (precno % res->pw) * (1 << cbgwidthexpn);
					int cbgystart = tlcbgystart + (precno / res->pw) * (1 << cbgheightexpn);
					int cbgxend = cbgxstart + (1 << cbgwidthexpn);
					int cbgyend = cbgystart + (1 << cbgheightexpn);
					
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					/* precinct size (global) */
					prc->x0 = int_max(cbgxstart, band->x0);
					prc->y0 = int_max(cbgystart, band->y0);
					prc->x1 = int_min(cbgxend, band->x1);
					prc->y1 = int_min(cbgyend, band->y1);
					
					tlcblkxstart = int_floordivpow2(prc->x0, cblkwidthexpn) << cblkwidthexpn;
					tlcblkystart = int_floordivpow2(prc->y0, cblkheightexpn) << cblkheightexpn;
					brcblkxend = int_ceildivpow2(prc->x1, cblkwidthexpn) << cblkwidthexpn;
					brcblkyend = int_ceildivpow2(prc->y1, cblkheightexpn) << cblkheightexpn;
					prc->cw = (brcblkxend - tlcblkxstart) >> cblkwidthexpn;
					prc->ch = (brcblkyend - tlcblkystart) >> cblkheightexpn;

					prc->cblks.dec = (opj_tcd_cblk_dec_t*) opj_malloc(prc->cw * prc->ch * sizeof(opj_tcd_cblk_dec_t));

					prc->incltree = tgt_create(prc->cw, prc->ch);
					prc->imsbtree = tgt_create(prc->cw, prc->ch);
					
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						int cblkxstart = tlcblkxstart + (cblkno % prc->cw) * (1 << cblkwidthexpn);
						int cblkystart = tlcblkystart + (cblkno / prc->cw) * (1 << cblkheightexpn);
						int cblkxend = cblkxstart + (1 << cblkwidthexpn);
						int cblkyend = cblkystart + (1 << cblkheightexpn);					

						opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
						cblk->data = NULL;
						cblk->segs = NULL;
						/* code-block size (global) */
						cblk->x0 = int_max(cblkxstart, prc->x0);
						cblk->y0 = int_max(cblkystart, prc->y0);
						cblk->x1 = int_min(cblkxend, prc->x1);
						cblk->y1 = int_min(cblkyend, prc->y1);
						cblk->numsegs = 0;
					}
				} /* precno */
			} /* bandno */
		} /* resno */
	} /* compno */
	/* tcd_dump(stdout, tcd, &tcd->tcd_image); */
}